

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

void __thiscall Fl_Preferences::Node::createIndex(Node *this)

{
  Node *pNVar1;
  Node *pNVar2;
  int iVar3;
  Node **ppNVar4;
  int iVar5;
  
  if ((this->field_0x30 & 4) == 0) {
    iVar5 = 0;
    pNVar1 = this->child_;
    for (pNVar2 = pNVar1; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next_) {
      iVar5 = iVar5 + 1;
    }
    iVar3 = iVar5;
    if (this->NIndex_ < iVar5) {
      this->NIndex_ = iVar5 + 0x10;
      ppNVar4 = (Node **)realloc(this->index_,(long)iVar5 * 8 + 0x80);
      this->index_ = ppNVar4;
      pNVar1 = this->child_;
    }
    for (; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next_) {
      this->index_[iVar3 + -1] = pNVar1;
      iVar3 = iVar3 + -1;
    }
    this->nIndex_ = iVar5;
    this->field_0x30 = this->field_0x30 | 4;
  }
  return;
}

Assistant:

void Fl_Preferences::Node::createIndex() {
  if (indexed_) return;
  int n = nChildren();
  if (n>NIndex_) {
    NIndex_ = n + 16;
    index_ = (Node**)realloc(index_, NIndex_*sizeof(Node**));
  }
  Node *nd;
  int i = 0;
  for (nd = child_; nd; nd = nd->next_, i++) {
    index_[n-i-1] = nd;
  }
  nIndex_ = n;
  indexed_ = 1;
}